

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_tests::iu_PrintToTest_x_iutest_x_U16StringStringView_Test::Body
          (iu_PrintToTest_x_iutest_x_U16StringStringView_Test *this)

{
  basic_string_view<char16_t,_std::char_traits<char16_t>_> val;
  Fixed *fixed;
  AssertionHelper local_1f8;
  size_t local_1b8;
  size_t sStack_1b0;
  Fixed local_1a8;
  undefined1 auStack_20 [8];
  u16string_view view;
  iu_PrintToTest_x_iutest_x_U16StringStringView_Test *this_local;
  
  view._M_str = (char16_t *)this;
  std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::basic_string_view
            ((basic_string_view<char16_t,_std::char_traits<char16_t>_> *)auStack_20,L"Hello");
  memset(&local_1a8,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_1a8);
  local_1b8 = (size_t)auStack_20;
  sStack_1b0 = view._M_len;
  val._M_str = (char16_t *)view._M_len;
  val._M_len = (size_t)auStack_20;
  fixed = iutest::AssertionHelper::Fixed::operator<<(&local_1a8,val);
  iutest::AssertionHelper::AssertionHelper
            (&local_1f8,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x40f,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=(&local_1f8,fixed);
  iutest::AssertionHelper::~AssertionHelper(&local_1f8);
  iutest::AssertionHelper::Fixed::~Fixed(&local_1a8);
  return;
}

Assistant:

IUTEST(PrintToTest, U16StringStringView)
{
    ::std::u16string_view view = u"Hello";
    IUTEST_SUCCEED() << view;
}